

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.h
# Opt level: O0

void __thiscall
soplex::SPxDevexPR<double>::SPxDevexPR(SPxDevexPR<double> *this,SPxDevexPR<double> *old)

{
  long in_RSI;
  Array<soplex::SPxPricer<double>::IdxElement> *in_RDI;
  undefined8 in_stack_ffffffffffffffc8;
  SPxPricer<double> *in_stack_ffffffffffffffd8;
  int n;
  SPxPricer<double> *in_stack_ffffffffffffffe0;
  
  SPxPricer<double>::SPxPricer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  (in_RDI->data).
  super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getName_004ee130;
  in_RDI[2].data.
  super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(in_RSI + 0x38);
  n = (int)((ulong)&in_RDI[2].data.
                    super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
  Array<soplex::SPxPricer<double>::IdxElement>::Array
            (in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  Array<soplex::SPxPricer<double>::IdxElement>::Array
            (in_RDI,(int)((ulong)&in_RDI[3].data.
                                  super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20));
  DIdxSet::DIdxSet((DIdxSet *)in_stack_ffffffffffffffe0,n);
  DIdxSet::DIdxSet((DIdxSet *)in_stack_ffffffffffffffe0,n);
  *(undefined1 *)
   &in_RDI[7].data.
    super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = 0;
  return;
}

Assistant:

SPxDevexPR(const SPxDevexPR& old)
      : SPxPricer<R>(old)
      , last(old.last)
      , refined(false)
   {}